

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

SUNErrCode SUNMemoryHelper_Dealloc(SUNMemoryHelper helper,SUNMemory mem,void *queue)

{
  SUNErrCode SVar1;
  
  if (mem != (SUNMemory)0x0) {
    SVar1 = (*helper->ops->dealloc)(helper,mem,queue);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Dealloc(SUNMemoryHelper helper, SUNMemory mem,
                                   void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->dealloc, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (!mem) { ier = SUN_SUCCESS; }
  else { ier = helper->ops->dealloc(helper, mem, queue); }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}